

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::walkTree<2,(TasGrid::RuleLocal::erule)1>
          (GridLocalPolynomial *this,MultiIndexSet *work,double *x,
          vector<int,_std::allocator<int>_> *sindx,vector<double,_std::allocator<double>_> *svals,
          double *y)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mkstoyanov[P]TASMANIAN_SparseGrids_tsgGridLocalPolynomial_hpp:318:47)>
  __comp;
  int iVar1;
  pointer piVar2;
  int *piVar3;
  pointer piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  pointer piVar6;
  int *piVar7;
  pointer pdVar8;
  int *r;
  value_type_conflict3 *__x;
  int iVar9;
  int *piVar10;
  bool isSupported;
  double basis_value;
  int p;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> idx;
  vector<double,_std::allocator<double>_> basis_derivative;
  vector<double,_std::allocator<double>_> vls;
  bool local_e1;
  vector<double,_std::allocator<double>_> *local_e0;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mkstoyanov[P]TASMANIAN_SparseGrids_tsgGridLocalPolynomial_hpp:318:47)>
  local_d8;
  double local_d0;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  _Vector_base<int,_std::allocator<int>_> local_b0;
  value_type_conflict3 *local_98;
  _Vector_base<int,_std::allocator<int>_> local_90;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_e0 = svals;
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_90,(long)this->top_level + 1,
             (allocator_type *)&local_b0);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_b0,(long)this->top_level + 1,
             (allocator_type *)&local_60);
  local_d8._M_comp.sindx = (anon_class_8_1_a89fe28c)(anon_class_8_1_a89fe28c)sindx;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,
             (long)(this->super_BaseCanonicalGrid).num_dimensions,(allocator_type *)&local_c8);
  local_98 = (this->roots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (__x = (this->roots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start; __comp._M_comp.sindx = local_d8._M_comp.sindx,
      __x != local_98; __x = __x + 1) {
    local_d0 = evalBasisSupported<(TasGrid::RuleLocal::erule)1>
                         (this,(work->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start + (long)*__x * work->num_dimensions
                          ,x,&local_e1);
    if (local_e1 == true) {
      ::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_d8._M_comp.sindx,__x);
      ::std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)local_e0,&local_d0);
      iVar1 = *__x;
      *local_b0._M_impl.super__Vector_impl_data._M_start = iVar1;
      piVar4 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar4[iVar1];
      *local_90._M_impl.super__Vector_impl_data._M_start = iVar1;
      iVar9 = 0;
      piVar2 = local_b0._M_impl.super__Vector_impl_data._M_start;
      piVar6 = local_90._M_impl.super__Vector_impl_data._M_start;
      while (iVar1 < piVar4[(long)*piVar2 + 1]) {
        if (piVar6[iVar9] < piVar4[(long)piVar2[iVar9] + 1]) {
          local_c8._M_impl.super__Vector_impl_data._M_start._0_4_ =
               (this->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[piVar6[iVar9]];
          local_d0 = evalBasisSupported<(TasGrid::RuleLocal::erule)1>
                               (this,(work->indexes).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start +
                                     (long)(int)local_c8._M_impl.super__Vector_impl_data._M_start *
                                     work->num_dimensions,x,&local_e1);
          if (local_e1 == true) {
            ::std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)local_d8._M_comp.sindx,
                       (value_type_conflict3 *)&local_c8);
            ::std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)local_e0,&local_d0);
            local_b0._M_impl.super__Vector_impl_data._M_start[(long)iVar9 + 1] =
                 (int)local_c8._M_impl.super__Vector_impl_data._M_start;
            piVar4 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_90._M_impl.super__Vector_impl_data._M_start[(long)iVar9 + 1] =
                 piVar4[(int)local_c8._M_impl.super__Vector_impl_data._M_start];
            piVar2 = local_b0._M_impl.super__Vector_impl_data._M_start;
            piVar6 = local_90._M_impl.super__Vector_impl_data._M_start;
            iVar9 = iVar9 + 1;
          }
          else {
            local_90._M_impl.super__Vector_impl_data._M_start[iVar9] =
                 local_90._M_impl.super__Vector_impl_data._M_start[iVar9] + 1;
            piVar4 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar2 = local_b0._M_impl.super__Vector_impl_data._M_start;
            piVar6 = local_90._M_impl.super__Vector_impl_data._M_start;
          }
        }
        else {
          piVar6[(long)iVar9 + -1] = piVar6[(long)iVar9 + -1] + 1;
          iVar9 = iVar9 + -1;
        }
        iVar1 = *piVar6;
      }
    }
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_c8,
             (vector<int,_std::allocator<int>_> *)local_d8._M_comp.sindx);
  __first._M_current._4_4_ = local_c8._M_impl.super__Vector_impl_data._M_start._4_4_;
  __first._M_current._0_4_ = (int)local_c8._M_impl.super__Vector_impl_data._M_start;
  iVar1 = 0;
  for (_Var5._M_current = __first._M_current;
      _Var5._M_current != local_c8._M_impl.super__Vector_impl_data._M_finish;
      _Var5._M_current = _Var5._M_current + 1) {
    *_Var5._M_current = iVar1;
    iVar1 = iVar1 + 1;
  }
  ::std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TasGrid::GridLocalPolynomial::walkTree<2,(TasGrid::RuleLocal::erule)1>(TasGrid::MultiIndexSet_const&,double_const*,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,double*)const::_lambda(int,int)_1_>>
            (__first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     local_c8._M_impl.super__Vector_impl_data._M_finish,__comp);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_78,
             (vector<int,_std::allocator<int>_> *)__comp._M_comp.sindx);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,
             (vector<double,_std::allocator<double>_> *)local_e0);
  piVar7 = *(int **)__comp._M_comp.sindx;
  piVar3 = (int *)CONCAT44(local_c8._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (int)local_c8._M_impl.super__Vector_impl_data._M_start);
  for (piVar10 = piVar3; piVar10 != local_c8._M_impl.super__Vector_impl_data._M_finish;
      piVar10 = piVar10 + 1) {
    *piVar7 = local_78._M_impl.super__Vector_impl_data._M_start[*piVar10];
    piVar7 = piVar7 + 1;
  }
  pdVar8 = (((_Vector_base<double,_std::allocator<double>_> *)
            &local_e0->super__Vector_base<double,_std::allocator<double>_>)->_M_impl).
           super__Vector_impl_data._M_start;
  for (; piVar3 != local_c8._M_impl.super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
    *pdVar8 = local_48._M_impl.super__Vector_impl_data._M_start[*piVar3];
    pdVar8 = pdVar8 + 1;
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b0);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
  return;
}

Assistant:

void walkTree(const MultiIndexSet &work, const double x[], std::vector<int> &sindx, std::vector<double> &svals, double *y) const{
        std::vector<int> monkey_count(top_level+1); // traverse the tree, counts the branches of the current node
        std::vector<int> monkey_tail(top_level+1); // traverse the tree, keeps track of the previous node (history)

        bool isSupported;
        double basis_value;
        std::vector<double> basis_derivative(num_dimensions);

        for(const auto &r : roots){
            if (mode == 3 or mode == 4) {
                diffBasisSupported<effrule>(work.getIndex(r), x, basis_derivative.data(), isSupported);
            } else {
                basis_value = evalBasisSupported<effrule>(work.getIndex(r), x, isSupported);
            }

            if (isSupported){
                if (mode == 0){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        y[k] += basis_value * s[k];
                }else if (mode == 1 or mode == 2){
                    sindx.push_back(r);
                    svals.push_back(basis_value);
                }else if (mode == 3){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        for (int d=0; d<num_dimensions; d++)
                            y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                }else{
                    sindx.push_back(r);
                    for (auto dx : basis_derivative)
                        svals.push_back(dx);
                }

                int current = 0;
                monkey_tail[0] = r;
                monkey_count[0] = pntr[r];

                while(monkey_count[0] < pntr[monkey_tail[0]+1]){
                    if (monkey_count[current] < pntr[monkey_tail[current]+1]){
                        int p = indx[monkey_count[current]];
                        if (mode == 3 or mode == 4){
                            diffBasisSupported<effrule>(work.getIndex(p), x, basis_derivative.data(), isSupported);
                        }else{
                            basis_value = evalBasisSupported<effrule>(work.getIndex(p), x, isSupported);
                        }
                        if (isSupported){
                            if (mode == 0){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    y[k] += basis_value * s[k];
                            }else if (mode == 1 or mode == 2){
                                sindx.push_back(p);
                                svals.push_back(basis_value);
                            }else if (mode == 3){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    for (int d=0; d<num_dimensions; d++)
                                        y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                            }else{
                                sindx.push_back(p);
                                for (auto dx : basis_derivative)
                                    svals.push_back(dx);
                            }
                            monkey_tail[++current] = p;
                            monkey_count[current] = pntr[p];
                        }else{
                            monkey_count[current]++;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }

        // according to https://docs.nvidia.com/cuda/cusparse/index.html#sparse-format
        // "... it is assumed that the indices are provided in increasing order and that each index appears only once."
        // This may not be a requirement for cusparseDgemvi(), but it may be that I have not tested it sufficiently
        // Also, see AccelerationDataGPUFull::cusparseMatveci() for inaccuracies in Nvidia documentation
        if (mode == 2){
            std::vector<int> map(sindx);
            std::iota(map.begin(), map.end(), 0);
            std::sort(map.begin(), map.end(), [&](int a, int b)->bool{ return (sindx[a] < sindx[b]); });

            std::vector<int> idx = sindx;
            std::vector<double> vls = svals;
            std::transform(map.begin(), map.end(), sindx.begin(), [&](int i)->int{ return idx[i]; });
            std::transform(map.begin(), map.end(), svals.begin(), [&](int i)->double{ return vls[i]; });
        }
    }